

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

trust_token_method_st ** __thiscall
testing::internal::ValuesInIteratorRangeGenerator<const_trust_token_method_st_*>::Iterator::Current
          (Iterator *this)

{
  trust_token_method_st **pptVar1;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_trust_token_method_st_*const_*,_std::default_delete<const_trust_token_method_st_*const>_>
      .super__Head_base<0UL,_const_trust_token_method_st_*const_*,_false>._M_head_impl ==
      (trust_token_method_st **)0x0) {
    pptVar1 = (trust_token_method_st **)operator_new(8);
    *pptVar1 = *(this->iterator_)._M_current;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_trust_token_method_st_*const_*,_std::default_delete<const_trust_token_method_st_*const>_>
    .super__Head_base<0UL,_const_trust_token_method_st_*const_*,_false>._M_head_impl = pptVar1;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_trust_token_method_st_*const_*,_std::default_delete<const_trust_token_method_st_*const>_>
         .super__Head_base<0UL,_const_trust_token_method_st_*const_*,_false>._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }